

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_recoverable_signature_parse_compact
              (secp256k1_context *ctx,secp256k1_ecdsa_recoverable_signature *sig,uchar *input64,
              int recid)

{
  int in_ECX;
  secp256k1_ecdsa_recoverable_signature *in_RDX;
  void *in_RSI;
  long in_RDI;
  int overflow;
  int ret;
  secp256k1_scalar s;
  secp256k1_scalar r;
  uint in_stack_ffffffffffffffc8;
  uint uVar1;
  int recid_00;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  uint local_4;
  
  local_4 = 1;
  recid_00 = 0;
  if (in_RDI != 0) {
    if (in_RSI == (void *)0x0) {
      secp256k1_callback_call
                ((secp256k1_callback *)CONCAT44(in_stack_ffffffffffffffd4,1),
                 (char *)(ulong)in_stack_ffffffffffffffc8);
      local_4 = 0;
    }
    else if (in_RDX == (secp256k1_ecdsa_recoverable_signature *)0x0) {
      secp256k1_callback_call
                ((secp256k1_callback *)CONCAT44(in_stack_ffffffffffffffd4,1),
                 (char *)(ulong)in_stack_ffffffffffffffc8);
      local_4 = 0;
    }
    else {
      uVar1 = in_stack_ffffffffffffffc8 & 0xffffff;
      if (-1 < in_ECX) {
        uVar1 = CONCAT13(in_ECX < 4,(int3)in_stack_ffffffffffffffc8);
      }
      if ((((byte)(uVar1 >> 0x18) ^ 0xff) & 1) == 0) {
        secp256k1_scalar_set_b32
                  ((secp256k1_scalar *)in_RDX,(uchar *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                   (int *)CONCAT44(in_stack_ffffffffffffffd4,1));
        local_4 = ((recid_00 != 0 ^ 0xffU) & 1) & local_4;
        secp256k1_scalar_set_b32
                  ((secp256k1_scalar *)in_RDX,(uchar *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                   (int *)CONCAT44(in_stack_ffffffffffffffd4,local_4));
        local_4 = ((recid_00 != 0 ^ 0xffU) & 1) & local_4;
        if (local_4 == 0) {
          memset(in_RSI,0,0x41);
        }
        else {
          secp256k1_ecdsa_recoverable_signature_save
                    (in_RDX,(secp256k1_scalar *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                     (secp256k1_scalar *)CONCAT44(in_stack_ffffffffffffffd4,local_4),recid_00);
        }
      }
      else {
        secp256k1_callback_call
                  ((secp256k1_callback *)CONCAT44(in_stack_ffffffffffffffd4,1),(char *)(ulong)uVar1)
        ;
        local_4 = 0;
      }
    }
    return local_4;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/modules/recovery/main_impl.h"
          ,0x2b,"test condition failed: ctx != NULL");
  abort();
}

Assistant:

int secp256k1_ecdsa_recoverable_signature_parse_compact(const secp256k1_context* ctx, secp256k1_ecdsa_recoverable_signature* sig, const unsigned char *input64, int recid) {
    secp256k1_scalar r, s;
    int ret = 1;
    int overflow = 0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(input64 != NULL);
    ARG_CHECK(recid >= 0 && recid <= 3);

    secp256k1_scalar_set_b32(&r, &input64[0], &overflow);
    ret &= !overflow;
    secp256k1_scalar_set_b32(&s, &input64[32], &overflow);
    ret &= !overflow;
    if (ret) {
        secp256k1_ecdsa_recoverable_signature_save(sig, &r, &s, recid);
    } else {
        memset(sig, 0, sizeof(*sig));
    }
    return ret;
}